

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.c
# Opt level: O2

void move_bc(int before,int control,xchar ballx,xchar bally,xchar chainx,xchar chainy)

{
  char cVar1;
  char cVar2;
  char cVar3;
  undefined1 uVar4;
  byte bVar5;
  int y;
  int x;
  obj *poVar6;
  
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014feec;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014fee7;
LAB_00150266:
    if (before == 0) {
      cVar1 = uball->where;
      if (((control & 2U) == 0) && ((control != 0 || (u.bc_order != 1)))) {
        x = (int)chainx;
        y = (int)chainy;
        place_object(uchain,level,x,y);
        poVar6 = uball;
        cVar2 = bally;
        cVar3 = ballx;
        if (cVar1 == '\x03') goto LAB_001503ea;
      }
      else {
        poVar6 = uchain;
        cVar2 = chainy;
        cVar3 = chainx;
        if (cVar1 != '\x03') {
          place_object(uball,level,(int)ballx,(int)bally);
          poVar6 = uchain;
        }
      }
      place_object(poVar6,level,(int)cVar3,(int)cVar2);
      newsym((int)chainx,(int)chainy);
      if (cVar1 == '\x03') {
        return;
      }
      x = (int)ballx;
      y = (int)bally;
    }
    else {
      if (control == 0) {
        u.bc_order = bc_order();
      }
      remove_object(uchain);
      newsym((int)uchain->ox,(int)uchain->oy);
      if (uball->where == '\x03') {
        return;
      }
      remove_object(uball);
      x = (int)uball->ox;
      y = (int)uball->oy;
    }
LAB_001503ea:
    newsym(x,y);
    return;
  }
LAB_0014fee7:
  if (ublindf != (obj *)0x0) {
LAB_0014feec:
    if (ublindf->oartifact == '\x1d') goto LAB_00150266;
  }
  if (before != 0) {
    return;
  }
  if ((~control & 3U) == 0) {
    if ((u.bc_felt & 1U) != 0) {
      *(uint *)(level->locations[uball->ox] + uball->oy) =
           *(uint *)(level->locations[uball->ox] + uball->oy) & 0xffe007ff |
           (u.bglyph & 0x3ffU) << 0xb;
      *(uint *)(level->locations[uball->ox] + uball->oy) =
           *(uint *)(level->locations[uball->ox] + uball->oy) & 0xc01fffff |
           (u.bobjmn & 0x1ffU) << 0x15;
      *(uint *)(level->locations[uball->ox] + uball->oy) =
           *(uint *)(level->locations[uball->ox] + uball->oy) & 0xbfffffff | (u._996_4_ & 1) << 0x1e
      ;
      *(uint *)(level->locations[uball->ox] + uball->oy) =
           *(uint *)(level->locations[uball->ox] + uball->oy) & 0x7fffffff |
           (u._996_4_ & 0xfffffffc) << 0x1d;
    }
    if ((u.bc_felt & 2U) != 0) {
      *(uint *)(level->locations[uchain->ox] + uchain->oy) =
           *(uint *)(level->locations[uchain->ox] + uchain->oy) & 0xffe007ff |
           (u.cglyph & 0x3ffU) << 0xb;
      *(uint *)(level->locations[uchain->ox] + uchain->oy) =
           *(uint *)(level->locations[uchain->ox] + uchain->oy) & 0xc01fffff |
           (u.cobjmn & 0x1ffU) << 0x15;
      *(uint *)(level->locations[uchain->ox] + uchain->oy) =
           *(uint *)(level->locations[uchain->ox] + uchain->oy) & 0xbfffffff |
           (u._996_4_ & 2) << 0x1d;
      *(uint *)(level->locations[uchain->ox] + uchain->oy) =
           *(uint *)(level->locations[uchain->ox] + uchain->oy) & 0x7fffffff |
           (u._996_4_ & 0xfffffff8) << 0x1c;
    }
    u.bc_felt = 0;
    u.bglyph = *(uint *)(level->locations[ballx] + bally) >> 0xb & 0x3ff;
    u.bobjmn = *(uint *)(level->locations[ballx] + bally) >> 0x15 & 0x1ff;
    u.cglyph = *(uint *)(level->locations[chainx] + chainy) >> 0xb & 0x3ff;
    u.cobjmn = *(uint *)(level->locations[chainx] + chainy) >> 0x15 & 0x1ff;
    u._997_3_ = u._997_3_;
    u._996_1_ = u._996_1_ & 0xf0 |
                (byte)((uint)*(undefined4 *)(level->locations[ballx] + bally) >> 0x1e) & 1 |
                (byte)((uint)*(undefined4 *)(level->locations[ballx] + bally) >> 0x1d) & 4 |
                (byte)((uint)*(undefined4 *)(level->locations[chainx] + chainy) >> 0x1d) & 2 |
                (byte)((uint)*(undefined4 *)(level->locations[chainx] + chainy) >> 0x1c) & 8;
    movobj(uball,ballx,bally);
    poVar6 = uchain;
    bally = chainy;
    ballx = chainx;
  }
  else if ((control & 1U) == 0) {
    if ((control & 2U) == 0) goto LAB_00150710;
    if ((u.bc_felt & 2U) != 0) {
      if (u.bc_order == 1) {
        if ((u.bc_felt & 1U) == 0) goto LAB_00150529;
        map_object(uball,0);
      }
      else if (u.bc_order == 0) {
LAB_00150529:
        *(uint *)(level->locations[uchain->ox] + uchain->oy) =
             *(uint *)(level->locations[uchain->ox] + uchain->oy) & 0xffe007ff |
             (u.cglyph & 0x3ffU) << 0xb;
        *(uint *)(level->locations[uchain->ox] + uchain->oy) =
             *(uint *)(level->locations[uchain->ox] + uchain->oy) & 0xc01fffff |
             (u.cobjmn & 0x1ffU) << 0x15;
        *(uint *)(level->locations[uchain->ox] + uchain->oy) =
             *(uint *)(level->locations[uchain->ox] + uchain->oy) & 0xbfffffff |
             (u._996_4_ & 2) << 0x1d;
        *(uint *)(level->locations[uchain->ox] + uchain->oy) =
             *(uint *)(level->locations[uchain->ox] + uchain->oy) & 0x7fffffff |
             (u._996_4_ & 0xfffffff8) << 0x1c;
      }
      u.bc_felt = u.bc_felt & 0xfffffffd;
    }
    uVar4 = u._996_1_;
    if (bally == chainy && ballx == chainx) {
      u.cglyph = u.bglyph;
      u.cobjmn = u.bobjmn;
      bVar5 = u._996_1_ * '\x02' & 10U | u._996_1_ & 0xf5;
    }
    else {
      u.cglyph = *(uint *)(level->locations[chainx] + chainy) >> 0xb & 0x3ff;
      u.cobjmn = *(uint *)(level->locations[chainx] + chainy) >> 0x15 & 0x1ff;
      u._996_4_ = u._996_4_ & 0xffffff00;
      bVar5 = uVar4 & 0xf5 |
              (byte)((uint)*(undefined4 *)(level->locations[chainx] + chainy) >> 0x1d) & 2 |
              (byte)((uint)*(undefined4 *)(level->locations[chainx] + chainy) >> 0x1c) & 8;
    }
    u._996_1_ = bVar5;
    poVar6 = uchain;
    bally = chainy;
    ballx = chainx;
  }
  else {
    if ((u.bc_felt & 1U) != 0) {
      if (u.bc_order == 2) {
        if ((u.bc_felt & 2U) == 0) goto LAB_0015041f;
        map_object(uchain,0);
      }
      else if (u.bc_order == 0) {
LAB_0015041f:
        *(uint *)(level->locations[uball->ox] + uball->oy) =
             *(uint *)(level->locations[uball->ox] + uball->oy) & 0xffe007ff |
             (u.bglyph & 0x3ffU) << 0xb;
        *(uint *)(level->locations[uball->ox] + uball->oy) =
             *(uint *)(level->locations[uball->ox] + uball->oy) & 0xc01fffff |
             (u.bobjmn & 0x1ffU) << 0x15;
        *(uint *)(level->locations[uball->ox] + uball->oy) =
             *(uint *)(level->locations[uball->ox] + uball->oy) & 0xbfffffff |
             (u._996_4_ & 1) << 0x1e;
        *(uint *)(level->locations[uball->ox] + uball->oy) =
             *(uint *)(level->locations[uball->ox] + uball->oy) & 0x7fffffff |
             (u._996_4_ & 0xfffffffc) << 0x1d;
      }
      u.bc_felt = u.bc_felt & 0xfffffffe;
    }
    uVar4 = u._996_1_;
    if (chainy == bally && chainx == ballx) {
      u.bglyph = u.cglyph;
      u.bobjmn = u.cobjmn;
      bVar5 = (byte)u._996_1_ >> 1 & 5 | u._996_1_ & 0xfa;
    }
    else {
      u.bglyph = *(uint *)(level->locations[ballx] + bally) >> 0xb & 0x3ff;
      u.bobjmn = *(uint *)(level->locations[ballx] + bally) >> 0x15 & 0x1ff;
      u._996_4_ = u._996_4_ & 0xffffff00;
      bVar5 = uVar4 & 0xfa |
              (byte)((uint)*(undefined4 *)(level->locations[ballx] + bally) >> 0x1e) & 1 |
              (byte)((uint)*(undefined4 *)(level->locations[ballx] + bally) >> 0x1d) & 4;
    }
    u._996_1_ = bVar5;
    poVar6 = uball;
  }
  movobj(poVar6,ballx,bally);
LAB_00150710:
  u.bc_order = bc_order();
  return;
}

Assistant:

void move_bc(int before, int control, xchar ballx, xchar bally, xchar chainx, xchar chainy)
{
    if (Blind) {
	/*
	 *  The hero is blind.  Time to work hard.  The ball and chain that
	 *  are attached to the hero are very special.  The hero knows that
	 *  they are attached, so when they move, the hero knows that they
	 *  aren't at the last position remembered.  This is complicated
	 *  by the fact that the hero can "feel" the surrounding locations
	 *  at any time, hence, making one or both of them show up again.
	 *  So, we have to keep track of which is felt at any one time and
	 *  act accordingly.
	 */
	if (!before) {
	    if ((control & BC_CHAIN) && (control & BC_BALL)) {
		/*
		 *  Both ball and chain moved.  If felt, drop glyph.
		 */
		if (u.bc_felt & BC_BALL)
		    BGLYPH_DROP(uball->ox, uball->oy);
		if (u.bc_felt & BC_CHAIN)
		    CGLYPH_DROP(uchain->ox, uchain->oy);
		u.bc_felt = 0;

		/* Pick up object memory at new location. */
		BGLYPH_PICK(ballx, bally);
		CGLYPH_PICK(chainx, chainy);

		movobj(uball,ballx,bally);
		movobj(uchain,chainx,chainy);
	    } else if (control & BC_BALL) {
		if (u.bc_felt & BC_BALL) {
		    if (u.bc_order == BCPOS_DIFFER) {	/* ball by itself */
			BGLYPH_DROP(uball->ox, uball->oy);
		    } else if (u.bc_order == BCPOS_BALL) {
			if (u.bc_felt & BC_CHAIN)   /* know chain is there */
			    map_object(uchain, 0);
			else
			    BGLYPH_DROP(uball->ox, uball->oy);
		    }
		    u.bc_felt &= ~BC_BALL;	/* no longer feel the ball */
		}

		/* Pick up object memory at new position. */
		if (ballx != chainx || bally != chainy)
		    BGLYPH_PICK(ballx, bally);
		else
		    GLYPH_CLONE_CHAIN_TO_BALL();

		movobj(uball,ballx,bally);
	    } else if (control & BC_CHAIN) {
		if (u.bc_felt & BC_CHAIN) {
		    if (u.bc_order == BCPOS_DIFFER) {
			CGLYPH_DROP(uchain->ox, uchain->oy);
		    } else if (u.bc_order == BCPOS_CHAIN) {
			if (u.bc_felt & BC_BALL)
			    map_object(uball, 0);
			else
			    CGLYPH_DROP(uchain->ox, uchain->oy);
		    }
		    u.bc_felt &= ~BC_CHAIN;
		}
		/* Pick up object memory at new position. */
		if (ballx != chainx || bally != chainy)
		    CGLYPH_PICK(chainx, chainy);
		else
		    GLYPH_CLONE_BALL_TO_CHAIN();

		movobj(uchain,chainx,chainy);
	    }

	    u.bc_order = bc_order();	/* reset the order */
	}

    } else {
	/*
	 *  The hero is not blind.  To make this work correctly, we need to
	 *  pick up the ball and chain before the hero moves, then put them
	 *  in their new positions after the hero moves.
	 */
	if (before) {
	    if (!control) {
		/*
		 * Neither ball nor chain is moving, so remember which was
		 * on top until !before.  Use the variable u.bc_order
		 * since it is only valid when blind.
		 */
		u.bc_order = bc_order();
	    }

	    remove_object(uchain);
	    newsym(uchain->ox, uchain->oy);
	    if (!carried(uball)) {
		remove_object(uball);
		newsym(uball->ox,  uball->oy);
	    }
	} else {
	    int on_floor = !carried(uball);

	    if ((control & BC_CHAIN) ||
				(!control && u.bc_order == BCPOS_CHAIN)) {
		/* If the chain moved or nothing moved & chain on top. */
		if (on_floor) place_object(uball, level, ballx, bally);
		place_object(uchain, level, chainx, chainy);	/* chain on top */
	    } else {
		place_object(uchain, level, chainx, chainy);
		if (on_floor) place_object(uball, level, ballx, bally);
							    /* ball on top */
	    }
	    newsym(chainx, chainy);
	    if (on_floor) newsym(ballx, bally);
	}
    }
}